

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O1

void ures_closeBundle(UResourceBundle *resB,UBool freeBundleObj)

{
  char *buffer;
  bool bVar1;
  
  if (resB != (UResourceBundle *)0x0) {
    if (resB->fData != (UResourceDataEntry *)0x0) {
      entryClose(resB->fData);
    }
    if (resB->fVersion != (char *)0x0) {
      uprv_free_63(resB->fVersion);
    }
    buffer = resB->fResPath;
    if (buffer != resB->fResBuf && buffer != (char *)0x0) {
      uprv_free_63(buffer);
    }
    resB->fResPath = (char *)0x0;
    resB->fResPathLen = 0;
    if (resB->fMagic1 == 0x12c9b17) {
      bVar1 = resB->fMagic2 == 0x12bb38b;
    }
    else {
      bVar1 = false;
    }
    if ((freeBundleObj != '\0') && (bVar1)) {
      uprv_free_63(resB);
      return;
    }
  }
  return;
}

Assistant:

static void
ures_closeBundle(UResourceBundle* resB, UBool freeBundleObj)
{
    if(resB != NULL) {
        if(resB->fData != NULL) {
            entryClose(resB->fData);
        }
        if(resB->fVersion != NULL) {
            uprv_free(resB->fVersion);
        }
        ures_freeResPath(resB);

        if(ures_isStackObject(resB) == FALSE && freeBundleObj) {
            uprv_free(resB);
        }
#if 0 /*U_DEBUG*/
        else {
            /* poison the data */
            uprv_memset(resB, -1, sizeof(UResourceBundle));
        }
#endif
    }
}